

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_matrix_stride_msl
          (CompilerMSL *this,SPIRType *type,bool packed,bool row_major)

{
  uint uVar1;
  uint32_t uVar2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,packed) != 0) {
    uVar1 = type->columns;
    if (type->columns < 2) {
      uVar1 = type->vecsize;
    }
    if (!row_major) {
      uVar1 = type->vecsize;
    }
    return uVar1 * (type->width >> 3);
  }
  uVar2 = get_declared_type_alignment_msl(this,type,false,row_major);
  return uVar2;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_matrix_stride_msl(const SPIRType &type, bool packed, bool row_major) const
{
	// For packed matrices, we just use the size of the vector type.
	// Otherwise, MatrixStride == alignment, which is the size of the underlying vector type.
	if (packed)
		return (type.width / 8) * ((row_major && type.columns > 1) ? type.columns : type.vecsize);
	else
		return get_declared_type_alignment_msl(type, false, row_major);
}